

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
kj::Array<kj::ArrayPtr<const_unsigned_char>_>::dispose
          (Array<kj::ArrayPtr<const_unsigned_char>_> *this)

{
  ArrayPtr<const_unsigned_char> *pAVar1;
  size_t sVar2;
  
  pAVar1 = this->ptr;
  if (pAVar1 != (ArrayPtr<const_unsigned_char> *)0x0) {
    sVar2 = this->size_;
    this->ptr = (ArrayPtr<const_unsigned_char> *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pAVar1,0x10,sVar2,sVar2,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    size_t sizeCopy = size_;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      size_ = 0;
      disposer->dispose(ptrCopy, sizeCopy, sizeCopy);
    }
  }